

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExplosionDescriptor.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::ExplosionDescriptor::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ExplosionDescriptor *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Descriptor:");
  poVar1 = std::operator<<(poVar1,"\n\tType:     ");
  EntityType::GetAsString_abi_cxx11_(&local_1c0,&(this->super_Descriptor).m_Type);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tMaterial: ");
  ENUMS::GetEnumAsStringExplosiveMaterial_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)this->m_ui16ExplMat,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\n\tForce:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32ExplForce);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString ExplosionDescriptor::GetAsString() const
{
    KStringStream ss;

    ss << "Descriptor:"
       << "\n\tType:     " << m_Type.GetAsString()
       << "\tMaterial: "   << GetEnumAsStringExplosiveMaterial( m_ui16ExplMat )
       << "\n\tForce:    " << m_f32ExplForce       
       << "\n";

    return ss.str();
}